

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_open(unqlite **ppDB,char *zFilename,uint iMode)

{
  unqlite *pDB;
  int rc;
  unqlite *pHandle;
  uint iMode_local;
  char *zFilename_local;
  unqlite **ppDB_local;
  
  *ppDB = (unqlite *)0x0;
  ppDB_local._4_4_ = unqliteCoreInitialize();
  if (ppDB_local._4_4_ == 0) {
    pDB = (unqlite *)SyMemBackendPoolAlloc(&sUnqlMPGlobal.sAllocator,0x118);
    if (pDB == (unqlite *)0x0) {
      ppDB_local._4_4_ = -1;
    }
    else {
      SyZero(pDB,0x118);
      pHandle._4_4_ = iMode;
      if (iMode == 0) {
        pHandle._4_4_ = 0x101;
      }
      ppDB_local._4_4_ = unqliteInitDatabase(pDB,&sUnqlMPGlobal.sAllocator,zFilename,pHandle._4_4_);
      if (ppDB_local._4_4_ == 0) {
        if (sUnqlMPGlobal.pDB != (unqlite *)0x0) {
          pDB->pNext = sUnqlMPGlobal.pDB;
          (sUnqlMPGlobal.pDB)->pPrev = pDB;
        }
        sUnqlMPGlobal.nDB = sUnqlMPGlobal.nDB + 1;
        sUnqlMPGlobal.pDB = pDB;
        pDB->nMagic = 0xdb7c2712;
        *ppDB = pDB;
        ppDB_local._4_4_ = 0;
      }
      else {
        SyMemBackendRelease((SyMemBackend *)pDB);
        SyMemBackendPoolFree(&sUnqlMPGlobal.sAllocator,pDB);
      }
    }
  }
  return ppDB_local._4_4_;
}

Assistant:

int unqlite_open(unqlite **ppDB,const char *zFilename,unsigned int iMode)
{
	unqlite *pHandle;
	int rc;
#if defined(UNTRUST)
	if( ppDB == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	*ppDB = 0;
	/* One-time automatic library initialization */
	rc = unqliteCoreInitialize();
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Allocate a new database handle */
	pHandle = (unqlite *)SyMemBackendPoolAlloc(&sUnqlMPGlobal.sAllocator, sizeof(unqlite));
	if( pHandle == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pHandle,sizeof(unqlite));
	if( iMode < 1 ){
		/* Assume a read-only database */
		iMode = UNQLITE_OPEN_READONLY|UNQLITE_OPEN_MMAP;
	}
	/* Init the database */
	rc = unqliteInitDatabase(pHandle,&sUnqlMPGlobal.sAllocator,zFilename,iMode);
	if( rc != UNQLITE_OK ){
		goto Release;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	if( !(iMode & UNQLITE_OPEN_NOMUTEX) && (sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE) ){
		 /* Associate a recursive mutex with this instance */
		 pHandle->pMutex = SyMutexNew(sUnqlMPGlobal.pMutexMethods, SXMUTEX_TYPE_RECURSIVE);
		 if( pHandle->pMutex == 0 ){
			 rc = UNQLITE_NOMEM;
			 goto Release;
		 }
	 }
#endif
	/* Link to the list of active DB handles */
#if defined(UNQLITE_ENABLE_THREADS)
	/* Enter the global mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, sUnqlMPGlobal.pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel == UNQLITE_THREAD_LEVEL_SINGLE */
#endif
	 MACRO_LD_PUSH(sUnqlMPGlobal.pDB,pHandle);
	 sUnqlMPGlobal.nDB++;
#if defined(UNQLITE_ENABLE_THREADS)
	/* Leave the global mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods, sUnqlMPGlobal.pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel == UNQLITE_THREAD_LEVEL_SINGLE */
#endif
	/* Set the magic number to identify a valid DB handle */
	 pHandle->nMagic = UNQLITE_DB_MAGIC;
	/* Make the handle available to the caller */
	*ppDB = pHandle;
	return UNQLITE_OK;
Release:
	SyMemBackendRelease(&pHandle->sMem);
	SyMemBackendPoolFree(&sUnqlMPGlobal.sAllocator,pHandle);
	return rc;
}